

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int pcut_main(pcut_item_t *last,int argc,char **argv)

{
  int iVar1;
  pcut_item_t *local_78;
  pcut_item_t *tmp;
  pcut_item_t *test;
  pcut_item_t *suite;
  int local_58;
  int i;
  int rc_tmp;
  int rc;
  int run_only_test;
  int run_only_suite;
  pcut_main_extra_t *main_extras_it;
  pcut_main_extra_t *main_extras;
  pcut_item_t *it;
  pcut_item_t *items;
  char **argv_local;
  pcut_item_t *ppStack_18;
  int argc_local;
  pcut_item_t *last_local;
  
  items = (pcut_item_t *)argv;
  argv_local._4_4_ = argc;
  ppStack_18 = last;
  it = pcut_fix_list_get_real_head(last);
  main_extras_it = ppStack_18->main_extras;
  rc = -1;
  rc_tmp = -1;
  if (main_extras_it == (pcut_main_extra_t *)0x0) {
    main_extras_it = empty_main_extra;
  }
  pcut_report_register_handler(&pcut_report_tap);
  for (_run_only_test = main_extras_it; _run_only_test->type != 3;
      _run_only_test = _run_only_test + 1) {
    if (_run_only_test->type == 2) {
      pcut_report_register_handler(&pcut_report_xml);
    }
    if (_run_only_test->type == 0) {
      (*_run_only_test->preinit_hook)((int *)((long)&argv_local + 4),(char ***)&items);
    }
  }
  if (1 < argv_local._4_4_) {
    for (suite._4_4_ = 1; suite._4_4_ < argv_local._4_4_; suite._4_4_ = suite._4_4_ + 1) {
      pcut_is_arg_with_number((char *)(&items->previous)[suite._4_4_],"-s",&rc);
      pcut_is_arg_with_number((char *)(&items->previous)[suite._4_4_],"-t",&rc_tmp);
      iVar1 = pcut_str_equals((char *)(&items->previous)[suite._4_4_],"-l");
      if (iVar1 != 0) {
        pcut_print_tests(it);
        return 0;
      }
      iVar1 = pcut_str_equals((char *)(&items->previous)[suite._4_4_],"-x");
      if (iVar1 != 0) {
        pcut_report_register_handler(&pcut_report_xml);
      }
      iVar1 = pcut_str_equals((char *)(&items->previous)[suite._4_4_],"-u");
      if (iVar1 != 0) {
        pcut_run_mode = 2;
      }
    }
  }
  setvbuf(_stdout,(char *)0x0,2,0);
  set_setup_teardown_callbacks(it);
  for (_run_only_test = main_extras_it; _run_only_test->type != 3;
      _run_only_test = _run_only_test + 1) {
    if (_run_only_test->type == 1) {
      (*_run_only_test->init_hook)();
    }
  }
  if ((rc < 0) || (rc_tmp < 0)) {
    if (rc < 1) {
      if (rc_tmp < 1) {
        pcut_report_init(it);
        i = 0;
        main_extras = (pcut_main_extra_t *)it;
        while (main_extras != (pcut_main_extra_t *)0x0) {
          if (*(int *)((long)&main_extras->preinit_hook + 4) == 4) {
            local_58 = run_suite((pcut_item_t *)main_extras,&local_78,(char *)items->previous);
            if (local_58 != 0) {
              i = local_58;
            }
            main_extras = (pcut_main_extra_t *)local_78;
          }
          else {
            main_extras = (pcut_main_extra_t *)pcut_get_real_next((pcut_item_t *)main_extras);
          }
        }
        pcut_report_done();
        last_local._4_4_ = i;
      }
      else {
        tmp = pcut_find_by_id(it,rc_tmp);
        if (tmp == (pcut_item_t *)0x0) {
          printf("Test not found, aborting!\n");
          last_local._4_4_ = 3;
        }
        else if (tmp->kind == 5) {
          if (pcut_run_mode == 2) {
            i = pcut_run_test_single(tmp);
          }
          else {
            i = pcut_run_test_forked(tmp);
          }
          last_local._4_4_ = i;
        }
        else {
          printf("Invalid test id!\n");
          last_local._4_4_ = 3;
        }
      }
    }
    else {
      test = pcut_find_by_id(it,rc);
      if (test == (pcut_item_t *)0x0) {
        printf("Suite not found, aborting!\n");
        last_local._4_4_ = 3;
      }
      else if (test->kind == 4) {
        run_suite(test,(pcut_item_t **)0x0,(char *)items->previous);
        last_local._4_4_ = 0;
      }
      else {
        printf("Invalid suite id!\n");
        last_local._4_4_ = 3;
      }
    }
  }
  else {
    printf("Specify either -s or -t!\n");
    last_local._4_4_ = 3;
  }
  return last_local._4_4_;
}

Assistant:

int pcut_main(pcut_item_t *last, int argc, char *argv[]) {
	pcut_item_t *items = pcut_fix_list_get_real_head(last);
	pcut_item_t *it;
	pcut_main_extra_t *main_extras = last->main_extras;
	pcut_main_extra_t *main_extras_it;

	int run_only_suite = -1;
	int run_only_test = -1;

	int rc, rc_tmp;

	if (main_extras == NULL) {
		main_extras = empty_main_extra;
	}

	pcut_report_register_handler(&pcut_report_tap);

	FOR_EACH_MAIN_EXTRA(main_extras, main_extras_it) {
		if (main_extras_it->type == PCUT_MAIN_EXTRA_REPORT_XML) {
			pcut_report_register_handler(&pcut_report_xml);
		}
		if (main_extras_it->type == PCUT_MAIN_EXTRA_PREINIT_HOOK) {
			main_extras_it->preinit_hook(&argc, &argv);
		}
	}

	if (argc > 1) {
		int i;
		for (i = 1; i < argc; i++) {
			pcut_is_arg_with_number(argv[i], "-s", &run_only_suite);
			pcut_is_arg_with_number(argv[i], "-t", &run_only_test);
			if (pcut_str_equals(argv[i], "-l")) {
				pcut_print_tests(items);
				return PCUT_OUTCOME_PASS;
			}
			if (pcut_str_equals(argv[i], "-x")) {
				pcut_report_register_handler(&pcut_report_xml);
			}
#ifndef PCUT_NO_LONG_JUMP
			if (pcut_str_equals(argv[i], "-u")) {
				pcut_run_mode = PCUT_RUN_MODE_SINGLE;
			}
#endif
		}
	}

	setvbuf(stdout, NULL, _IONBF, 0);
	set_setup_teardown_callbacks(items);

	FOR_EACH_MAIN_EXTRA(main_extras, main_extras_it) {
		if (main_extras_it->type == PCUT_MAIN_EXTRA_INIT_HOOK) {
			main_extras_it->init_hook();
		}
	}

	PCUT_DEBUG("run_only_suite = %d   run_only_test = %d", run_only_suite, run_only_test);

	if ((run_only_suite >= 0) && (run_only_test >= 0)) {
		printf("Specify either -s or -t!\n");
		return PCUT_OUTCOME_BAD_INVOCATION;
	}

	if (run_only_suite > 0) {
		pcut_item_t *suite = pcut_find_by_id(items, run_only_suite);
		if (suite == NULL) {
			printf("Suite not found, aborting!\n");
			return PCUT_OUTCOME_BAD_INVOCATION;
		}
		if (suite->kind != PCUT_KIND_TESTSUITE) {
			printf("Invalid suite id!\n");
			return PCUT_OUTCOME_BAD_INVOCATION;
		}

		run_suite(suite, NULL, argv[0]);
		return PCUT_OUTCOME_PASS;
	}

	if (run_only_test > 0) {
		pcut_item_t *test = pcut_find_by_id(items, run_only_test);
		if (test == NULL) {
			printf("Test not found, aborting!\n");
			return PCUT_OUTCOME_BAD_INVOCATION;
		}
		if (test->kind != PCUT_KIND_TEST) {
			printf("Invalid test id!\n");
			return PCUT_OUTCOME_BAD_INVOCATION;
		}

		if (pcut_run_mode == PCUT_RUN_MODE_SINGLE) {
			rc = pcut_run_test_single(test);
		} else {
			rc = pcut_run_test_forked(test);
		}

		return rc;
	}

	/* Otherwise, run the whole thing. */
	pcut_report_init(items);

	rc = PCUT_OUTCOME_PASS;

	it = items;
	while (it != NULL) {
		if (it->kind == PCUT_KIND_TESTSUITE) {
			pcut_item_t *tmp;
			rc_tmp = run_suite(it, &tmp, argv[0]);
			if (rc_tmp != PCUT_OUTCOME_PASS) {
				rc = rc_tmp;
			}
			it = tmp;
		} else {
			it = pcut_get_real_next(it);
		}
	}

	pcut_report_done();

	return rc;
}